

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

void __thiscall
rsg::DeclarationStatement::DeclarationStatement
          (DeclarationStatement *this,GeneratorState *state,Variable *variable)

{
  ConstValueRangeAccess other;
  ConstValueRangeAccess valueRange_00;
  bool bVar1;
  Storage SVar2;
  deUint32 dVar3;
  VariableManager *pVVar4;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *this_00;
  reference ppVVar5;
  Random *this_01;
  iterator first;
  iterator last;
  ValueEntry *this_02;
  Expression *pEVar6;
  Scalar *in_stack_fffffffffffffe20;
  byte local_1ad;
  undefined1 auStack_158 [7];
  bool isConst;
  Scalar *pSStack_150;
  Scalar *local_148;
  undefined1 local_140 [8];
  ValueRange valueRange;
  ExpressionGenerator generator;
  undefined8 uStack_98;
  undefined8 local_90;
  byte local_81;
  bool createInitializer;
  ValueEntry *value;
  __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_60;
  __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_58;
  const_iterator i;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> candidates;
  vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *liveVars;
  Variable *variable_local;
  GeneratorState *state_local;
  DeclarationStatement *this_local;
  
  Statement::Statement(&this->super_Statement);
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__DeclarationStatement_0025a568;
  this->m_variable = (Variable *)0x0;
  this->m_expression = (Expression *)0x0;
  liveVars = (vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)variable;
  if (variable == (Variable *)0x0) {
    pVVar4 = GeneratorState::getVariableManager(state);
    this_00 = VariableManager::getLiveVariables(pVVar4);
    std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::vector
              ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)&i);
    local_58._M_current =
         (Variable **)std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin(this_00)
    ;
    while( true ) {
      local_60._M_current =
           (Variable **)std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::end(this_00)
      ;
      bVar1 = __gnu_cxx::operator!=(&local_58,&local_60);
      if (!bVar1) break;
      ppVVar5 = __gnu_cxx::
                __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
                ::operator*(&local_58);
      bVar1 = anon_unknown_0::canDeclareVariable(*ppVVar5);
      if (bVar1) {
        ppVVar5 = __gnu_cxx::
                  __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
                  ::operator*(&local_58);
        std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::push_back
                  ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)&i,ppVVar5);
      }
      __gnu_cxx::
      __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
      ::operator++(&local_58,0);
    }
    this_01 = GeneratorState::getRandom(state);
    first = std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin
                      ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)&i);
    last = std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::end
                     ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)&i);
    liveVars = (vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)
               de::Random::
               choose<rsg::Variable*,__gnu_cxx::__normal_iterator<rsg::Variable**,std::vector<rsg::Variable*,std::allocator<rsg::Variable*>>>>
                         (this_01,(__normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
                                   )first._M_current,
                          (__normal_iterator<rsg::Variable_**,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
                           )last._M_current);
    std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::~vector
              ((vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_> *)&i);
  }
  this->m_variable = (Variable *)liveVars;
  pVVar4 = GeneratorState::getVariableManager(state);
  this_02 = VariableManager::getValue(pVVar4,(Variable *)liveVars);
  SVar2 = Variable::getStorage(this->m_variable);
  if (SVar2 == STORAGE_LOCAL) {
    local_1ad = 0;
    if (this_02 != (ValueEntry *)0x0) {
      ValueEntry::getValueRange
                ((ConstValueRangeAccess *)
                 &generator.m_expressionStack.
                  super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,this_02);
      valueRange_00.m_min = (Scalar *)local_90;
      valueRange_00.m_type = (VariableType *)uStack_98;
      valueRange_00.m_max = in_stack_fffffffffffffe20;
      bVar1 = isUndefinedValueRange(valueRange_00);
      local_1ad = bVar1 ^ 0xff;
    }
    local_81 = local_1ad & 1;
  }
  else if (SVar2 == STORAGE_CONST) {
    local_81 = 1;
  }
  else {
    local_81 = 0;
  }
  if (local_81 == 0) {
    pVVar4 = GeneratorState::getVariableManager(state);
    VariableManager::declareVariable(pVVar4,(Variable *)liveVars);
  }
  else {
    ExpressionGenerator::ExpressionGenerator
              ((ExpressionGenerator *)
               &valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,state);
    ValueEntry::getValueRange((ConstValueRangeAccess *)auStack_158,this_02);
    other.m_min = pSStack_150;
    other.m_type = _auStack_158;
    other.m_max = local_148;
    ValueRange::ValueRange((ValueRange *)local_140,other);
    pVVar4 = GeneratorState::getVariableManager(state);
    VariableManager::declareVariable(pVVar4,(Variable *)liveVars);
    SVar2 = Variable::getStorage(this->m_variable);
    if (SVar2 == STORAGE_CONST) {
      dVar3 = GeneratorState::getExpressionFlags(state);
      GeneratorState::pushExpressionFlags(state,dVar3 | 1);
    }
    pEVar6 = ExpressionGenerator::generate
                       ((ExpressionGenerator *)
                        &valueRange.m_max.
                         super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(ValueRange *)local_140,1);
    this->m_expression = pEVar6;
    if (SVar2 == STORAGE_CONST) {
      GeneratorState::popExpressionFlags(state);
    }
    ValueRange::~ValueRange((ValueRange *)local_140);
    ExpressionGenerator::~ExpressionGenerator
              ((ExpressionGenerator *)
               &valueRange.m_max.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

DeclarationStatement::DeclarationStatement (GeneratorState& state, Variable* variable)
	: m_variable	(DE_NULL)
	, m_expression	(DE_NULL)
{
	if (variable == DE_NULL)
	{
		// Choose random
		// \todo [2011-02-03 pyry] Allocate a new here?
		// \todo [2011-05-26 pyry] Weights?
		const vector<Variable*>&	liveVars = state.getVariableManager().getLiveVariables();
		vector<Variable*>			candidates;

		for (vector<Variable*>::const_iterator i = liveVars.begin(); i != liveVars.end(); i++)
		{
			if (canDeclareVariable(*i))
				candidates.push_back(*i);
		}

		variable = state.getRandom().choose<Variable*>(candidates.begin(), candidates.end());
	}

	DE_ASSERT(variable);
	m_variable = variable;

	const ValueEntry* value = state.getVariableManager().getValue(variable);

	bool createInitializer = false;

	switch (m_variable->getStorage())
	{
		case Variable::STORAGE_CONST:
			DE_ASSERT(value);
			createInitializer = true;
			break;

		case Variable::STORAGE_LOCAL:
			// \note Currently booleans are always treated as not having undefined range and thus
			//       initializer is always created.
			createInitializer = value && !isUndefinedValueRange(value->getValueRange());
			break;

		default:
			createInitializer = false;
			break;
	}

	if (createInitializer)
	{
		ExpressionGenerator generator(state);

		// Take copy of value range for generating initializer expression
		ValueRange valueRange = value->getValueRange();

		// Declare (removes value entry)
		state.getVariableManager().declareVariable(variable);

		bool isConst = m_variable->getStorage() == Variable::STORAGE_CONST;

		if (isConst)
			state.pushExpressionFlags(state.getExpressionFlags() | CONST_EXPR);

		m_expression = generator.generate(valueRange, 1);

		if (isConst)
			state.popExpressionFlags();
	}
	else
		state.getVariableManager().declareVariable(variable);
}